

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

CURLcode Curl_conncache_add_conn(conncache *connc,connectdata *conn)

{
  SessionHandle *data;
  char *__s;
  curl_hash *h;
  long lVar1;
  CURLcode CVar2;
  connectbundle *pcVar3;
  size_t sVar4;
  void *pvVar5;
  connectbundle *new_bundle;
  connectbundle *local_38;
  
  local_38 = (connectbundle *)0x0;
  data = conn->data;
  pcVar3 = Curl_conncache_find_bundle((data->state).conn_cache,(conn->host).name);
  if (pcVar3 == (connectbundle *)0x0) {
    CVar2 = Curl_bundle_create(data,&local_38);
    pcVar3 = local_38;
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    __s = (conn->host).name;
    h = ((data->state).conn_cache)->hash;
    sVar4 = strlen(__s);
    pvVar5 = Curl_hash_add(h,__s,sVar4 + 1,pcVar3);
    pcVar3 = local_38;
    if (pvVar5 == (void *)0x0) {
      Curl_bundle_destroy(local_38);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar2 = Curl_bundle_add_conn(pcVar3,conn);
  if (CVar2 == CURLE_OK) {
    lVar1 = connc->next_connection_id;
    connc->next_connection_id = lVar1 + 1;
    conn->connection_id = lVar1;
    connc->num_connections = connc->num_connections + 1;
    CVar2 = CURLE_OK;
  }
  else if (local_38 != (connectbundle *)0x0) {
    conncache_remove_bundle((data->state).conn_cache,local_38);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_conncache_add_conn(struct conncache *connc,
                                 struct connectdata *conn)
{
  CURLcode result;
  struct connectbundle *bundle;
  struct connectbundle *new_bundle = NULL;
  struct SessionHandle *data = conn->data;

  bundle = Curl_conncache_find_bundle(data->state.conn_cache,
                                      conn->host.name);
  if(!bundle) {
    result = Curl_bundle_create(data, &new_bundle);
    if(result != CURLE_OK)
      return result;

    if(!conncache_add_bundle(data->state.conn_cache,
                             conn->host.name, new_bundle)) {
      Curl_bundle_destroy(new_bundle);
      return CURLE_OUT_OF_MEMORY;
    }
    bundle = new_bundle;
  }

  result = Curl_bundle_add_conn(bundle, conn);
  if(result != CURLE_OK) {
    if(new_bundle)
      conncache_remove_bundle(data->state.conn_cache, new_bundle);
    return result;
  }

  conn->connection_id = connc->next_connection_id++;
  connc->num_connections++;

  return CURLE_OK;
}